

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetWriter::PrepareRowGroup
          (ParquetWriter *this,ColumnDataCollection *buffer,PreparedRowGroup *result)

{
  _RowGroup__isset *p_Var1;
  ColumnWriter *pCVar2;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *puVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  reference pvVar7;
  reference this_00;
  type __args;
  reference pvVar8;
  vector<duckdb::Vector,_true> *pvVar9;
  reference pvVar10;
  type pCVar11;
  reference pvVar12;
  pointer pCVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state;
  size_type sVar17;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *puVar18;
  vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> col_writers;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  write_states;
  vector<unsigned_long,_true> column_ids;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> local_258;
  ulong local_240;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  local_238;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  long local_1f8;
  PreparedRowGroup *local_1f0;
  ParquetWriter *local_1e8;
  undefined1 local_1e0 [8];
  void *local_1d8;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
  *local_1c0;
  _Head_base<0UL,_duckdb::ColumnWriterState_*,_false> local_1b8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b0;
  void *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  ColumnDataChunkIterationHelper local_118 [8];
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_110;
  void *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_1e8 = this;
  lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(*(unsigned_long *)(buffer + 0x28));
  (result->row_group).num_rows = lVar6;
  p_Var1 = &(result->row_group).__isset;
  *p_Var1 = (_RowGroup__isset)((byte)*p_Var1 | 2);
  if (*(long *)(buffer + 0x18) - *(long *)(buffer + 0x10) != 0) {
    local_1c0 = (vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                 *)&result->states;
    uVar15 = (*(long *)(buffer + 0x18) - *(long *)(buffer + 0x10) >> 3) * -0x5555555555555555;
    local_1e8 = (ParquetWriter *)&local_1e8->column_writers;
    local_1f8 = 0;
    uVar14 = 0;
    local_1f0 = result;
    do {
      local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_258.
      super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (reference_wrapper<duckdb::ColumnWriter> *)0x0;
      local_258.
      super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.
      super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (reference_wrapper<duckdb::ColumnWriter> *)0x0;
      local_238.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_238.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
            *)0x0;
      local_238.
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
            *)0x0;
      if (uVar15 != uVar14) {
        uVar16 = uVar15 + local_1f8;
        if (7 < uVar16) {
          uVar16 = 8;
        }
        lVar6 = 0;
        do {
          local_1b8._M_head_impl = (ColumnWriterState *)(uVar14 + lVar6);
          if (local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_218,
                       (iterator)
                       local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1b8);
          }
          else {
            *local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_1b8._M_head_impl;
            local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          pvVar7 = vector<unsigned_long,_true>::back((vector<unsigned_long,_true> *)&local_218);
          this_00 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                                  *)local_1e8,*pvVar7);
          __args = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                   ::operator*(this_00);
          if (local_258.
              super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_258.
              super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
            ::_M_realloc_insert<duckdb::ColumnWriter&>
                      ((vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
                        *)&local_258,
                       (iterator)
                       local_258.
                       super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                       .
                       super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,__args);
          }
          else {
            (local_258.
             super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_data = __args;
            local_258.
            super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_258.
                 super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::back(&local_258);
          (*pvVar8->_M_data->_vptr_ColumnWriter[2])(&local_1b8,pvVar8->_M_data,local_1f0);
          std::
          vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
                      *)&local_238,
                     (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      *)&local_1b8);
          if (local_1b8._M_head_impl != (ColumnWriterState *)0x0) {
            (*(local_1b8._M_head_impl)->_vptr_ColumnWriterState[1])();
          }
          lVar6 = lVar6 + 1;
        } while (uVar16 + (uVar16 == 0) != lVar6);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,&local_218);
      duckdb::ColumnDataCollection::Chunks(local_1e0,buffer,&local_48);
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ColumnDataChunkIterationHelper::begin((ColumnDataChunkIterationHelper *)&local_1b8);
      ColumnDataChunkIterationHelper::end(local_118);
      local_240 = local_1f8 + uVar15;
      uVar16 = 8;
      if (local_240 < 8) {
        uVar16 = local_240;
      }
      while (cVar4 = duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               ((ColumnDataChunkIterator *)&local_1b8,
                                (ColumnDataChunkIterator *)local_118), cVar4 != '\0') {
        pvVar9 = (vector<duckdb::Vector,_true> *)
                 duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                           ((ColumnDataChunkIterator *)&local_1b8);
        if (uVar15 != uVar14) {
          sVar17 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               (&local_258,sVar17);
            iVar5 = (*pvVar8->_M_data->_vptr_ColumnWriter[3])();
            if ((char)iVar5 != '\0') {
              pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                                 (&local_258,sVar17);
              pCVar2 = pvVar8->_M_data;
              pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                      *)&local_238,sVar17);
              pCVar11 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                        ::operator*(pvVar10);
              pvVar12 = vector<duckdb::Vector,_true>::operator[](pvVar9,sVar17);
              (*pCVar2->_vptr_ColumnWriter[4])
                        (pCVar2,pCVar11,0,pvVar12,*(undefined8 *)(pvVar9 + 0x18));
            }
            sVar17 = sVar17 + 1;
          } while (uVar16 + (uVar16 == 0) != sVar17);
        }
        duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++
                  ((ColumnDataChunkIterator *)&local_1b8);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_110);
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (void *)0x0) {
        operator_delete(local_148);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b0);
      if (local_1d8 != (void *)0x0) {
        operator_delete(local_1d8);
      }
      puVar18 = local_238.
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = local_238.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (uVar15 != uVar14) {
        uVar16 = 8;
        if (local_240 < 8) {
          uVar16 = local_240;
        }
        sVar17 = 0;
        do {
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                             (&local_258,sVar17);
          iVar5 = (*pvVar8->_M_data->_vptr_ColumnWriter[3])();
          if ((char)iVar5 != '\0') {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               (&local_258,sVar17);
            pCVar2 = pvVar8->_M_data;
            pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_238,sVar17);
            pCVar11 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar10);
            (*pCVar2->_vptr_ColumnWriter[5])(pCVar2,pCVar11);
          }
          sVar17 = sVar17 + 1;
          puVar18 = local_238.
                    super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar3 = local_238.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar16 + (uVar16 == 0) != sVar17);
      }
      for (; puVar18 != puVar3; puVar18 = puVar18 + 1) {
        pCVar13 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator->(puVar18);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                  (&(pCVar13->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   *(size_type *)(buffer + 0x28));
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,&local_218);
      duckdb::ColumnDataCollection::Chunks(local_1e0,buffer,&local_60);
      if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ColumnDataChunkIterationHelper::begin((ColumnDataChunkIterationHelper *)&local_1b8);
      ColumnDataChunkIterationHelper::end(local_118);
      uVar16 = 8;
      if (local_240 < 8) {
        uVar16 = local_240;
      }
      while (cVar4 = duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               ((ColumnDataChunkIterator *)&local_1b8,
                                (ColumnDataChunkIterator *)local_118), cVar4 != '\0') {
        pvVar9 = (vector<duckdb::Vector,_true> *)
                 duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                           ((ColumnDataChunkIterator *)&local_1b8);
        if (uVar15 != uVar14) {
          sVar17 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               (&local_258,sVar17);
            pCVar2 = pvVar8->_M_data;
            pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_238,sVar17);
            pCVar11 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar10);
            pvVar12 = vector<duckdb::Vector,_true>::operator[](pvVar9,sVar17);
            (*pCVar2->_vptr_ColumnWriter[6])
                      (pCVar2,pCVar11,0,pvVar12,*(undefined8 *)(pvVar9 + 0x18));
            sVar17 = sVar17 + 1;
          } while (uVar16 + (uVar16 == 0) != sVar17);
        }
        duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++
                  ((ColumnDataChunkIterator *)&local_1b8);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_110);
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (void *)0x0) {
        operator_delete(local_148);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b0);
      if (local_1d8 != (void *)0x0) {
        operator_delete(local_1d8);
      }
      if (uVar15 != uVar14) {
        uVar16 = 8;
        if (local_240 < 8) {
          uVar16 = local_240;
        }
        sVar17 = 0;
        do {
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                             (&local_258,sVar17);
          pCVar2 = pvVar8->_M_data;
          pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                  *)&local_238,sVar17);
          pCVar11 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                    ::operator*(pvVar10);
          (*pCVar2->_vptr_ColumnWriter[7])(pCVar2,pCVar11);
          sVar17 = sVar17 + 1;
        } while (uVar16 + (uVar16 == 0) != sVar17);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,&local_218);
      duckdb::ColumnDataCollection::Chunks(local_1e0,buffer,&local_78);
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      ColumnDataChunkIterationHelper::begin((ColumnDataChunkIterationHelper *)&local_1b8);
      ColumnDataChunkIterationHelper::end(local_118);
      uVar16 = local_240;
      if (7 < local_240) {
        uVar16 = 8;
      }
      while (cVar4 = duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                               ((ColumnDataChunkIterator *)&local_1b8,
                                (ColumnDataChunkIterator *)local_118), cVar4 != '\0') {
        pvVar9 = (vector<duckdb::Vector,_true> *)
                 duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                           ((ColumnDataChunkIterator *)&local_1b8);
        if (uVar15 != uVar14) {
          sVar17 = 0;
          do {
            pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                               (&local_258,sVar17);
            pCVar2 = pvVar8->_M_data;
            pvVar10 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                                    *)&local_238,sVar17);
            pCVar11 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                      ::operator*(pvVar10);
            pvVar12 = vector<duckdb::Vector,_true>::operator[](pvVar9,sVar17);
            (*pCVar2->_vptr_ColumnWriter[8])(pCVar2,pCVar11,pvVar12,*(undefined8 *)(pvVar9 + 0x18));
            sVar17 = sVar17 + 1;
          } while (uVar16 + (uVar16 == 0) != sVar17);
        }
        duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++
                  ((ColumnDataChunkIterator *)&local_1b8);
      }
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_110);
      if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
      }
      if (local_148 != (void *)0x0) {
        operator_delete(local_148);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b0);
      puVar18 = local_238.
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = local_238.
               super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1d8 != (void *)0x0) {
        operator_delete(local_1d8);
        puVar18 = local_238.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = local_238.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; puVar18 != puVar3; puVar18 = puVar18 + 1) {
        std::
        vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                  (local_1c0,puVar18);
      }
      std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ::~vector(&local_238);
      if (local_258.
          super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.
                        super_vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                        .
                        super__Vector_base<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 8;
      uVar15 = (*(long *)(buffer + 0x18) - *(long *)(buffer + 0x10) >> 3) * -0x5555555555555555;
      local_1f8 = local_1f8 + -8;
    } while (uVar14 < uVar15);
  }
  return;
}

Assistant:

void ParquetWriter::PrepareRowGroup(ColumnDataCollection &buffer, PreparedRowGroup &result) {
	// We write 8 columns at a time so that iterating over ColumnDataCollection is more efficient
	static constexpr idx_t COLUMNS_PER_PASS = 8;

	// We want these to be buffer-managed
	D_ASSERT(buffer.GetAllocatorType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR);

	// set up a new row group for this chunk collection
	auto &row_group = result.row_group;
	row_group.num_rows = NumericCast<int64_t>(buffer.Count());
	row_group.__isset.file_offset = true;

	auto &states = result.states;
	// iterate over each of the columns of the chunk collection and write them
	D_ASSERT(buffer.ColumnCount() == column_writers.size());
	for (idx_t col_idx = 0; col_idx < buffer.ColumnCount(); col_idx += COLUMNS_PER_PASS) {
		const auto next = MinValue<idx_t>(buffer.ColumnCount() - col_idx, COLUMNS_PER_PASS);
		vector<column_t> column_ids;
		vector<reference<ColumnWriter>> col_writers;
		vector<unique_ptr<ColumnWriterState>> write_states;
		for (idx_t i = 0; i < next; i++) {
			column_ids.emplace_back(col_idx + i);
			col_writers.emplace_back(*column_writers[column_ids.back()]);
			write_states.emplace_back(col_writers.back().get().InitializeWriteState(row_group));
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				if (col_writers[i].get().HasAnalyze()) {
					col_writers[i].get().Analyze(*write_states[i], nullptr, chunk.data[i], chunk.size());
				}
			}
		}

		for (idx_t i = 0; i < next; i++) {
			if (col_writers[i].get().HasAnalyze()) {
				col_writers[i].get().FinalizeAnalyze(*write_states[i]);
			}
		}

		// Reserving these once at the start really pays off
		for (auto &write_state : write_states) {
			write_state->definition_levels.reserve(buffer.Count());
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Prepare(*write_states[i], nullptr, chunk.data[i], chunk.size());
			}
		}

		for (idx_t i = 0; i < next; i++) {
			col_writers[i].get().BeginWrite(*write_states[i]);
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Write(*write_states[i], chunk.data[i], chunk.size());
			}
		}

		for (auto &write_state : write_states) {
			states.push_back(std::move(write_state));
		}
	}
}